

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void send_ssi_file(mg_connection *conn,char *path,mg_file *filep,int include_level)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ptrdiff_t pVar8;
  int *piVar9;
  uint uVar10;
  mg_file *filep_00;
  char *pcVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  mg_connection *buf_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  FILE *__stream;
  char *pcVar12;
  mg_file file;
  char path_1 [512];
  char buf [8192];
  char file_name [8192];
  int local_427c;
  char *local_4278;
  uint local_426c;
  mg_file local_4268;
  mg_connection local_4238 [3];
  char local_2038 [511];
  undefined1 local_1e39;
  
  if (10 < include_level) {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,(char *)filep,include_level,
               "SSI #include level is too deep (%s)");
    return;
  }
  if (filep != (mg_file *)0x0) {
    __stream = (FILE *)(filep->access).fp;
    if (__stream == (FILE *)0x0) {
      uVar10 = 0;
    }
    else {
      local_426c = include_level + 2;
      filep_00 = (mg_file *)(ulong)local_426c;
      uVar10 = 0;
      bVar3 = false;
      bVar4 = false;
      local_4278 = path;
      do {
        iVar5 = fgetc(__stream);
        if (iVar5 == -1) break;
        if (bVar3) {
          pcVar11 = (char *)(long)(int)uVar10;
          if (iVar5 == 0x3e) {
            *(char *)((long)&local_4238[0].request_info.http_headers[0x15].value + (long)pcVar11) =
                 '>';
            pcVar11 = pcVar11 + 1;
            if (bVar4) {
              *(char *)((long)&local_4238[0].request_info.http_headers[0x15].value + (long)pcVar11)
                   = '\0';
              if ((int)uVar10 < 0xc) {
                if (8 < (int)uVar10) goto LAB_00126a5a;
              }
              else {
                pcVar11 = (char *)0x6564756c;
                uVar10 = CONCAT31(local_4238[0].request_info.http_headers[0x16].name._1_3_,
                                  local_4238[0].request_info.http_headers[0x16].name._0_1_) ^
                         0x6564756c | local_4238[0].request_info.http_headers._349_4_ ^ 0x6c636e69;
                filep_00 = (mg_file *)(ulong)uVar10;
                if (uVar10 == 0) {
                  local_4268.stat.is_directory = 0;
                  local_4268.stat.is_gzipped = 0;
                  local_4268.stat.location = 0;
                  local_4268.stat._28_4_ = 0;
                  local_4268.stat.size = 0;
                  local_4268.stat.last_modified = 0;
                  local_4268.access.fp = (FILE *)0x0;
                  local_427c = 0;
                  puVar1 = (undefined1 *)
                           ((long)&local_4238[0].request_info.http_headers[0x16].name + 4);
                  pcVar11 = local_2038;
                  iVar5 = __isoc99_sscanf(puVar1," virtual=\"%511[^\"]\"",pcVar11);
                  if (iVar5 == 1) {
                    local_1e39 = 0;
                    pcVar11 = conn->dom_ctx->config[0xf];
                    filep_00 = (mg_file *)0x200;
                    buf_00 = local_4238;
                    pcVar12 = "%s/%s";
LAB_00126baa:
                    mg_snprintf(conn,&local_427c,(char *)buf_00,(size_t)filep_00,pcVar12,pcVar11);
                    iVar5 = (int)pcVar12;
                    pcVar12 = extraout_RDX_01;
                    if (local_427c == 0) {
                      iVar6 = mg_fopen(local_4238,(char *)0x1,(int)&local_4268,filep_00);
                      if (iVar6 != 0) {
                        fclose_on_exec(&local_4268.access,conn);
                        pVar8 = match_prefix_strlen(conn->dom_ctx->config[0x20],(char *)local_4238);
                        if (pVar8 < 1) {
                          filep_00 = (mg_file *)0x7fffffffffffffff;
                          send_file_data(conn,&local_4268,0,0x7fffffffffffffff,iVar5);
                        }
                        else {
                          filep_00 = (mg_file *)(ulong)local_426c;
                          send_ssi_file(conn,(char *)local_4238,&local_4268,local_426c);
                        }
                        if ((FILE *)local_4268.access.fp != (FILE *)0x0) {
                          fclose((FILE *)local_4268.access.fp);
                        }
                        goto LAB_00126bd1;
                      }
                      piVar9 = __errno_location();
                      strerror(*piVar9);
                      pcVar11 = "Cannot open SSI #include: [%s]: fopen(%s): %s";
                      pcVar12 = extraout_RDX_02;
                    }
                    else {
LAB_00126bb8:
                      pcVar11 = "SSI #include path length overflow: [%s]";
                    }
                  }
                  else {
                    iVar5 = __isoc99_sscanf(puVar1," abspath=\"%511[^\"]\"",pcVar11);
                    buf_00 = local_4238;
                    if (iVar5 == 1) {
                      local_1e39 = 0;
                      filep_00 = (mg_file *)0x200;
LAB_00126ba0:
                      pcVar12 = "%s";
                      goto LAB_00126baa;
                    }
                    iVar5 = __isoc99_sscanf(puVar1," file=\"%511[^\"]\"",pcVar11);
                    if ((iVar5 == 1) ||
                       (iVar5 = __isoc99_sscanf(puVar1," \"%511[^\"]\"",pcVar11), iVar5 == 1)) {
                      local_1e39 = 0;
                      filep_00 = (mg_file *)0x200;
                      mg_snprintf(conn,&local_427c,(char *)buf_00,0x200,"%s",local_4278);
                      pcVar12 = extraout_RDX_00;
                      if (local_427c == 0) {
                        pcVar12 = strrchr((char *)buf_00,0x2f);
                        if (pcVar12 != (char *)0x0) {
                          pcVar12[1] = '\0';
                        }
                        sVar7 = strlen((char *)buf_00);
                        buf_00 = (mg_connection *)
                                 (local_4238[0].request_info.remote_addr + (sVar7 - 0x48));
                        filep_00 = (mg_file *)(0x200 - sVar7);
                        goto LAB_00126ba0;
                      }
                      goto LAB_00126bb8;
                    }
                    pcVar11 = "Bad SSI #include: [%s]";
                    pcVar12 = extraout_RDX;
                  }
                  mg_cry_internal_wrap(conn,(mg_context *)0x0,pcVar12,(uint)filep_00,pcVar11,puVar1)
                  ;
                  goto LAB_00126bd1;
                }
LAB_00126a5a:
                if (local_4238[0].request_info.http_headers._349_4_ == 0x63657865) {
                  do_ssi_exec(conn,(char *)((long)&local_4238[0].request_info.http_headers[0x16].
                                                   name + 1));
                  goto LAB_00126bd1;
                }
              }
              mg_cry_internal_wrap
                        (conn,(mg_context *)0x0,pcVar11,(uint)filep_00,
                         "%s: unknown SSI command: \"%s\"",local_4278,
                         &local_4238[0].request_info.http_headers[0x15].value);
            }
            else {
              mg_write(conn,&local_4238[0].request_info.http_headers[0x15].value,(size_t)pcVar11);
            }
LAB_00126bd1:
            bVar3 = false;
            bVar4 = false;
            uVar10 = 0;
          }
          else {
            *(char *)((long)&local_4238[0].request_info.http_headers[0x15].value + (long)pcVar11) =
                 (char)iVar5;
            if (uVar10 + 1 == 5) {
              uVar10 = local_4238[0].request_info.http_headers[0x15].value._4_1_ ^ 0x23 |
                       (uint)local_4238[0].request_info.http_headers[0x15].value ^ 0x2d2d213c;
              filep_00 = (mg_file *)(ulong)uVar10;
              bVar3 = true;
              if (uVar10 == 0) {
                bVar4 = true;
              }
              uVar10 = 5;
            }
            else {
              bVar3 = true;
              bVar2 = 0x1ffd < (int)uVar10;
              uVar10 = uVar10 + 1;
              if (bVar2) {
                mg_cry_internal_wrap
                          (conn,(mg_context *)0x0,pcVar11,(uint)filep_00,"%s: tag is too large",
                           local_4278);
                return;
              }
            }
          }
        }
        else if (iVar5 == 0x3c) {
          if (0 < (int)uVar10) {
            mg_write(conn,&local_4238[0].request_info.http_headers[0x15].value,(ulong)uVar10);
          }
          local_4238[0].request_info.http_headers[0x15].value._0_4_ =
               CONCAT31(local_4238[0].request_info.http_headers[0x15].value._1_3_,0x3c);
          uVar10 = 1;
          bVar3 = true;
        }
        else {
          filep_00 = (mg_file *)(long)(int)uVar10;
          uVar10 = uVar10 + 1;
          *(char *)((long)&local_4238[0].request_info.http_headers[0x15].value + (long)filep_00) =
               (char)iVar5;
          bVar3 = false;
          if (uVar10 == 0x2000) {
            mg_write(conn,&local_4238[0].request_info.http_headers[0x15].value,0x2000);
            uVar10 = 0;
            bVar3 = false;
          }
        }
        __stream = (FILE *)(filep->access).fp;
      } while (__stream != (FILE *)0x0);
    }
    if (0 < (int)uVar10) {
      mg_write(conn,&local_4238[0].request_info.http_headers[0x15].value,(ulong)uVar10);
    }
  }
  return;
}

Assistant:

static void
send_ssi_file(struct mg_connection *conn,
              const char *path,
              struct mg_file *filep,
              int include_level)
{
	char buf[MG_BUF_LEN];
	int ch, len, in_tag, in_ssi_tag;

	if (include_level > 10) {
		mg_cry_internal(conn, "SSI #include level is too deep (%s)", path);
		return;
	}

	in_tag = in_ssi_tag = len = 0;

	/* Read file, byte by byte, and look for SSI include tags */
	while ((ch = mg_fgetc(filep)) != EOF) {

		if (in_tag) {
			/* We are in a tag, either SSI tag or html tag */

			if (ch == '>') {
				/* Tag is closing */
				buf[len++] = '>';

				if (in_ssi_tag) {
					/* Handle SSI tag */
					buf[len] = 0;

					if ((len > 12) && !memcmp(buf + 5, "include", 7)) {
						do_ssi_include(conn, path, buf + 12, include_level + 1);
#if !defined(NO_POPEN)
					} else if ((len > 9) && !memcmp(buf + 5, "exec", 4)) {
						do_ssi_exec(conn, buf + 9);
#endif /* !NO_POPEN */
					} else {
						mg_cry_internal(conn,
						                "%s: unknown SSI "
						                "command: \"%s\"",
						                path,
						                buf);
					}
					len = 0;
					in_ssi_tag = in_tag = 0;

				} else {
					/* Not an SSI tag */
					/* Flush buffer */
					(void)mg_write(conn, buf, (size_t)len);
					len = 0;
					in_tag = 0;
				}

			} else {
				/* Tag is still open */
				buf[len++] = (char)(ch & 0xff);

				if ((len == 5) && !memcmp(buf, "<!--#", 5)) {
					/* All SSI tags start with <!--# */
					in_ssi_tag = 1;
				}

				if ((len + 2) > (int)sizeof(buf)) {
					/* Tag to long for buffer */
					mg_cry_internal(conn, "%s: tag is too large", path);
					return;
				}
			}

		} else {

			/* We are not in a tag yet. */
			if (ch == '<') {
				/* Tag is opening */
				in_tag = 1;

				if (len > 0) {
					/* Flush current buffer.
					 * Buffer is filled with "len" bytes. */
					(void)mg_write(conn, buf, (size_t)len);
				}
				/* Store the < */
				len = 1;
				buf[0] = '<';

			} else {
				/* No Tag */
				/* Add data to buffer */
				buf[len++] = (char)(ch & 0xff);
				/* Flush if buffer is full */
				if (len == (int)sizeof(buf)) {
					mg_write(conn, buf, (size_t)len);
					len = 0;
				}
			}
		}
	}

	/* Send the rest of buffered data */
	if (len > 0) {
		mg_write(conn, buf, (size_t)len);
	}
}